

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrobjs.c
# Opt level: O1

FT_Error pfr_slot_load(FT_GlyphSlot_conflict pfrslot,FT_Size pfrsize,FT_UInt gindex,
                      FT_Int32 load_flags)

{
  FT_Outline *outline;
  short sVar1;
  uint uVar2;
  uint uVar3;
  FT_Stream pFVar4;
  FT_Generic_Finalizer p_Var5;
  FT_Pos FVar6;
  FT_Pos FVar7;
  bool bVar8;
  uint uVar9;
  undefined8 uVar10;
  short *psVar11;
  FT_Face pFVar12;
  FT_UInt format_00;
  FT_Error FVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  FT_Long scaled_advance;
  uint uVar17;
  ulong uVar18;
  FT_Pos *pFVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  FT_Vector *pFVar27;
  byte *pbVar28;
  byte *pbVar29;
  uint uVar30;
  uint uVar31;
  uint *puVar32;
  bool bVar33;
  bool bVar34;
  FT_UInt ysize;
  FT_UInt xsize;
  ulong local_90;
  FT_Face local_88;
  uint *local_80;
  FT_Size local_78;
  FT_Long advance;
  uint local_68;
  FT_UInt format;
  FT_Long ypos;
  uchar *local_58;
  FT_Long xpos;
  long local_48;
  long local_40;
  long local_38;
  
  local_88 = pfrslot->face;
  uVar14 = gindex - 1;
  if (gindex == 0) {
    uVar14 = 0;
  }
  if (local_88 == (FT_Face)0x0) {
    return 6;
  }
  if (*(uint *)&local_88[2].generic.data <= uVar14) {
    return 6;
  }
  local_68 = load_flags;
  if (((load_flags & 9U) == 0) && (iVar15 = *(int *)&local_88[2].style_name, iVar15 != 0)) {
    pFVar4 = local_88->stream;
    local_80 = (uint *)((ulong)uVar14 * 0x10 + local_88[2].bbox.xMin);
    puVar32 = *(uint **)&local_88[2].num_fixed_sizes;
    do {
      if ((*puVar32 == (uint)(pfrsize->metrics).x_ppem) &&
         (puVar32[1] == (uint)(pfrsize->metrics).y_ppem)) {
        uVar2 = puVar32[2];
        local_78 = pfrsize;
        FVar13 = FT_Stream_Seek(pFVar4,(ulong)puVar32[6] + *(long *)&local_88[2].units_per_EM);
        iVar15 = 6;
        if (FVar13 != 0) goto LAB_00149d9d;
        iVar15 = (uVar2 & 1) + 5;
        if ((uVar2 & 2) == 0) {
          iVar15 = (uVar2 & 1) + 4;
        }
        FVar13 = FT_Stream_EnterFrame
                           (pFVar4,(ulong)((iVar15 + (uint)((uVar2 >> 2 & 1) != 0)) * puVar32[7]));
        if (FVar13 != 0) {
          iVar15 = 6;
          goto LAB_00149d9d;
        }
        pbVar29 = pFVar4->cursor;
        uVar2 = puVar32[2];
        uVar17 = puVar32[7];
        uVar3 = *local_80;
        uVar24 = uVar2 & 1;
        iVar15 = uVar24 + 5;
        if ((uVar2 & 2) == 0) {
          iVar15 = uVar24 + 4;
        }
        uVar26 = iVar15 + (uint)((uVar2 >> 2 & 1) != 0);
        if ((uVar2 & 0x40) != 0) goto LAB_00149fbb;
        pbVar28 = pFVar4->limit;
        puVar32[2] = uVar2 | 0x80;
        if (pbVar28 < pbVar29 + uVar26 * uVar17) goto LAB_00149efd;
        if (uVar26 * uVar17 == 0) goto LAB_00149fb2;
        uVar18 = 0xffffffffffffffff;
        pbVar28 = pbVar29;
        goto LAB_00149f85;
      }
      puVar32 = puVar32 + 10;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
  }
  goto LAB_00149a4f;
LAB_00149efd:
  puVar32[2] = uVar2 & 0xffffff3f;
  goto LAB_00149fb2;
  while (pbVar28 = pbVar28 + uVar26, uVar18 = uVar20, pbVar28 < pbVar29 + uVar26 * uVar17) {
LAB_00149f85:
    uVar20 = (ulong)*pbVar28;
    if (uVar24 != 0) {
      uVar20 = (ulong)CONCAT11(*pbVar28,pbVar28[1]);
    }
    if ((long)uVar20 <= (long)uVar18) goto LAB_00149efd;
  }
LAB_00149fb2:
  *(byte *)(puVar32 + 2) = (byte)puVar32[2] | 0x40;
LAB_00149fbb:
  uVar2 = puVar32[2];
  local_90 = 0;
  if ((char)uVar2 < '\0') {
    uVar30 = 0;
    do {
      if (uVar17 <= uVar30) goto LAB_00149fcd;
      uVar31 = uVar30 + uVar17 >> 1;
      uVar18 = (ulong)(uVar31 * uVar26);
      uVar21 = (uint)pbVar29[uVar18];
      if (uVar24 == 0) {
        lVar16 = uVar18 + 1;
      }
      else {
        lVar16 = uVar18 + 2;
        uVar21 = (uint)CONCAT11(pbVar29[uVar18],pbVar29[uVar18 + 1]);
      }
      pbVar28 = pbVar29 + lVar16;
      uVar9 = uVar31 + 1;
      if (uVar3 <= uVar21) {
        uVar9 = uVar30;
      }
      if (uVar21 <= uVar3) {
        uVar30 = uVar9;
        uVar31 = uVar17;
      }
      uVar17 = uVar31;
    } while (uVar21 != uVar3);
    local_90 = (ulong)*pbVar28;
    if ((uVar2 & 2) == 0) {
      pbVar29 = pbVar28 + 1;
    }
    else {
      pbVar29 = pbVar28 + 2;
      local_90 = (ulong)CONCAT11(*pbVar28,pbVar28[1]);
    }
    uVar18 = (ulong)pbVar29[1];
    if ((uVar2 & 4) == 0) {
      uVar20 = (ulong)*pbVar29 << 8;
    }
    else {
      uVar18 = (ulong)((uint)pbVar29[1] << 8 | (uint)*pbVar29 << 0x10);
      uVar20 = (ulong)pbVar29[2];
    }
    puVar32 = (uint *)(uVar20 | uVar18);
  }
  else {
LAB_00149fcd:
    puVar32 = (uint *)0x0;
  }
  FT_Stream_ExitFrame(pFVar4);
  FVar13 = 6;
  iVar15 = FVar13;
  if (local_90 != 0) {
    FVar13 = 0;
    iVar15 = FVar13;
  }
LAB_00149d9d:
  if (iVar15 != 6) {
    pfrsize = local_78;
    if (iVar15 != 0) goto LAB_00149a4f;
    xpos = 0;
    ypos = 0;
    xsize = 0;
    ysize = 0;
    format = 0;
    advance = (FT_Long)(int)local_80[1];
    uVar2 = *(uint *)((long)&local_88[1].driver + 4);
    if (uVar2 != *(uint *)&local_88[1].driver) {
      advance = FT_MulDiv(advance,(ulong)*(uint *)&local_88[1].driver,(ulong)uVar2);
    }
    pFVar12 = local_88;
    pfrslot->linearHoriAdvance = advance;
    scaled_advance =
         FT_MulDiv((ulong)(local_78->metrics).x_ppem << 8,(long)(int)local_80[1],
                   (ulong)*(uint *)((long)&local_88[1].driver + 4));
    advance = scaled_advance;
    FVar13 = FT_Stream_Seek(pFVar4,(long)puVar32 + (ulong)(uint)pFVar12[1].num_fixed_sizes);
    iVar15 = 6;
    if ((FVar13 == 0) && (FVar13 = FT_Stream_EnterFrame(pFVar4,local_90), FVar13 == 0)) {
      local_58 = pFVar4->cursor;
      FVar13 = pfr_load_bitmap_metrics
                         (&local_58,pFVar4->limit,scaled_advance,&xpos,&ypos,&xsize,&ysize,&advance,
                          &format);
      format_00 = format;
      if (FVar13 == 0) {
        if (format == 2) {
          uVar18 = (ulong)ysize * (ulong)xsize;
          uVar20 = local_90 + 1 >> 1;
          bVar33 = uVar18 < uVar20 * 0xff;
          bVar34 = uVar18 + uVar20 * -0xff == 0;
          bVar8 = bVar33 || bVar34;
          FVar13 = (uint)(!bVar33 && !bVar34) << 3;
        }
        else {
          if (format == 1) {
            bVar33 = (ulong)ysize * (ulong)xsize < local_90 * 0xf;
            bVar34 = (ulong)ysize * (ulong)xsize + local_90 * -0xf == 0;
          }
          else {
            if (format != 0) {
              FVar13 = 8;
              bVar8 = false;
              goto LAB_0014a13f;
            }
            uVar18 = (ulong)ysize * (ulong)xsize + 7 >> 3;
            bVar33 = uVar18 < local_90;
            bVar34 = uVar18 == local_90;
          }
          bVar8 = bVar33 || bVar34;
          FVar13 = (uint)(!bVar33 && !bVar34) << 3;
        }
LAB_0014a13f:
        if (bVar8) {
          uVar18 = (ulong)ysize;
          if (((int)ysize < 0 || (int)xpos != xpos) ||
             ((long)(ypos + uVar18) < -0x80000000 || (long)(uVar18 ^ 0x7fffffff) < ypos)) {
            FVar13 = 0x17;
            bVar8 = false;
          }
          else {
            FVar13 = 0;
            bVar8 = true;
          }
          if (bVar8) {
            pfrslot->format = FT_GLYPH_FORMAT_BITMAP;
            (pfrslot->bitmap).width = xsize;
            (pfrslot->bitmap).rows = ysize;
            iVar15 = (int)(xsize + 7) >> 3;
            (pfrslot->bitmap).pitch = iVar15;
            (pfrslot->bitmap).pixel_mode = '\x01';
            (pfrslot->metrics).width = (ulong)xsize * 0x40;
            (pfrslot->metrics).height = uVar18 << 6;
            (pfrslot->metrics).horiBearingX = xpos << 6;
            (pfrslot->metrics).horiBearingY = ypos << 6;
            (pfrslot->metrics).horiAdvance = (advance >> 2) + 0x20U & 0xffffffffffffffc0;
            (pfrslot->metrics).vertBearingX = (long)((ulong)xsize * -0x40) >> 1;
            (pfrslot->metrics).vertBearingY = 0;
            (pfrslot->metrics).vertAdvance = (local_78->metrics).height;
            pfrslot->bitmap_left = (int)xpos;
            pfrslot->bitmap_top = (int)ypos + ysize;
            if ((local_68 >> 0x16 & 1) == 0) {
              FVar13 = ft_glyphslot_alloc_bitmap(pfrslot,(long)iVar15 * uVar18);
              if (FVar13 != 0) goto LAB_0014a2b4;
              pfr_load_bitmap_bits
                        (local_58,pFVar4->limit,format_00,
                         (byte)*(undefined4 *)&local_88[1].field_0x4c & 2,&pfrslot->bitmap);
            }
            FVar13 = 0;
          }
        }
      }
LAB_0014a2b4:
      FT_Stream_ExitFrame(pFVar4);
      iVar15 = 0;
    }
    if ((iVar15 != 6) && (pfrsize = local_78, iVar15 != 0)) goto LAB_00149a4f;
  }
  pfrsize = local_78;
  if (FVar13 == 0) {
    return 0;
  }
LAB_00149a4f:
  if (((uint)load_flags >> 0xe & 1) != 0) {
    return 6;
  }
  lVar16 = local_88[2].bbox.xMin;
  lVar22 = (ulong)uVar14 * 0x10;
  pfrslot->format = FT_GLYPH_FORMAT_OUTLINE;
  (pfrslot->outline).n_contours = 0;
  (pfrslot->outline).n_points = 0;
  local_80 = (uint *)(ulong)(uint)local_88[1].num_fixed_sizes;
  pFVar4 = local_88->stream;
  uVar14 = *(uint *)(lVar16 + 8 + lVar22);
  uVar2 = *(uint *)(lVar16 + 0xc + lVar22);
  local_78 = pfrsize;
  FT_GlyphLoader_Rewind((FT_GlyphLoader)pfrslot[1].generic.finalizer);
  pfrslot[1].reserved = 0;
  FVar13 = pfr_glyph_load_rec((PFR_Glyph)(pfrslot + 1),pFVar4,(FT_ULong)local_80,(ulong)uVar2,
                              (ulong)uVar14);
  if (FVar13 == 0) {
    outline = &pfrslot->outline;
    p_Var5 = pfrslot[1].generic.finalizer;
    *(undefined8 *)&(pfrslot->outline).flags = *(undefined8 *)(p_Var5 + 0x38);
    uVar10 = *(undefined8 *)(p_Var5 + 0x18);
    pFVar27 = *(FT_Vector **)(p_Var5 + 0x20);
    psVar11 = *(short **)(p_Var5 + 0x30);
    (pfrslot->outline).tags = *(char **)(p_Var5 + 0x28);
    (pfrslot->outline).contours = psVar11;
    outline->n_contours = (short)uVar10;
    outline->n_points = (short)((ulong)uVar10 >> 0x10);
    *(int *)&outline->field_0x4 = (int)((ulong)uVar10 >> 0x20);
    (pfrslot->outline).points = pFVar27;
    uVar14 = (pfrslot->outline).flags & 0xfffffffa;
    (pfrslot->outline).flags = uVar14 + 4;
    if ((local_78 != (FT_Size)0x0) && ((local_78->metrics).y_ppem < 0x18)) {
      (pfrslot->outline).flags = uVar14 | 0x104;
    }
    (pfrslot->metrics).horiAdvance = 0;
    (pfrslot->metrics).vertAdvance = 0;
    lVar16 = (long)*(int *)(lVar16 + lVar22 + 4);
    uVar14 = *(uint *)((long)&local_88[1].driver + 4);
    if (uVar14 != *(uint *)&local_88[1].driver) {
      lVar16 = FT_MulDiv(lVar16,(ulong)*(uint *)&local_88[1].driver,(ulong)uVar14);
    }
    pFVar19 = &(pfrslot->metrics).vertAdvance;
    if (((ulong)local_88[1].autohint.data & 1) == 0) {
      pFVar19 = &(pfrslot->metrics).horiAdvance;
    }
    *pFVar19 = lVar16;
    FVar6 = (pfrslot->metrics).horiAdvance;
    FVar7 = (pfrslot->metrics).vertAdvance;
    pfrslot->linearHoriAdvance = FVar6;
    pfrslot->linearVertAdvance = FVar7;
    (pfrslot->metrics).vertBearingX = 0;
    (pfrslot->metrics).vertBearingY = 0;
    if ((local_68 & 1) == 0) {
      sVar1 = (pfrslot->outline).n_points;
      iVar25 = (int)sVar1;
      iVar23 = (int)(local_78->metrics).x_scale;
      iVar15 = (int)(local_78->metrics).y_scale;
      if (0 < sVar1) {
        pFVar27 = (pfrslot->outline).points;
        do {
          lVar16 = (long)(int)pFVar27->x * (long)iVar23;
          pFVar27->x = (long)(int)((ulong)(lVar16 + 0x8000 + (lVar16 >> 0x3f)) >> 0x10);
          lVar16 = (long)(int)pFVar27->y * (long)iVar15;
          pFVar27->y = (long)(int)((ulong)(lVar16 + 0x8000 + (lVar16 >> 0x3f)) >> 0x10);
          pFVar27 = pFVar27 + 1;
          iVar25 = iVar25 + -1;
        } while (iVar25 != 0);
      }
      lVar16 = (long)iVar23 * (long)(int)FVar6;
      (pfrslot->metrics).horiAdvance =
           (long)(int)((ulong)(lVar16 + 0x8000 + (lVar16 >> 0x3f)) >> 0x10);
      lVar16 = (long)iVar15 * (long)(int)FVar7;
      (pfrslot->metrics).vertAdvance =
           (long)(int)((ulong)(lVar16 + 0x8000 + (lVar16 >> 0x3f)) >> 0x10);
    }
    FT_Outline_Get_CBox(outline,(FT_BBox *)&xpos);
    (pfrslot->metrics).width = local_40 - xpos;
    (pfrslot->metrics).height = local_38 - local_48;
    (pfrslot->metrics).horiBearingX = xpos;
    (pfrslot->metrics).horiBearingY = local_48;
    return 0;
  }
  return FVar13;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_slot_load( FT_GlyphSlot  pfrslot,         /* PFR_Slot */
                 FT_Size       pfrsize,         /* PFR_Size */
                 FT_UInt       gindex,
                 FT_Int32      load_flags )
  {
    PFR_Slot     slot    = (PFR_Slot)pfrslot;
    PFR_Size     size    = (PFR_Size)pfrsize;
    FT_Error     error;
    PFR_Face     face    = (PFR_Face)pfrslot->face;
    PFR_Char     gchar;
    FT_Outline*  outline = &pfrslot->outline;
    FT_ULong     gps_offset;


    FT_TRACE1(( "pfr_slot_load: glyph index %d\n", gindex ));

    if ( gindex > 0 )
      gindex--;

    if ( !face || gindex >= face->phy_font.num_chars )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* try to load an embedded bitmap */
    if ( ( load_flags & ( FT_LOAD_NO_SCALE | FT_LOAD_NO_BITMAP ) ) == 0 )
    {
      error = pfr_slot_load_bitmap(
                slot,
                size,
                gindex,
                ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) != 0 );
      if ( !error )
        goto Exit;
    }

    if ( load_flags & FT_LOAD_SBITS_ONLY )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    gchar               = face->phy_font.chars + gindex;
    pfrslot->format     = FT_GLYPH_FORMAT_OUTLINE;
    outline->n_points   = 0;
    outline->n_contours = 0;
    gps_offset          = face->header.gps_section_offset;

    /* load the glyph outline (FT_LOAD_NO_RECURSE isn't supported) */
    error = pfr_glyph_load( &slot->glyph, face->root.stream,
                            gps_offset, gchar->gps_offset, gchar->gps_size );

    if ( !error )
    {
      FT_BBox            cbox;
      FT_Glyph_Metrics*  metrics = &pfrslot->metrics;
      FT_Pos             advance;
      FT_UInt            em_metrics, em_outline;
      FT_Bool            scaling;


      scaling = FT_BOOL( ( load_flags & FT_LOAD_NO_SCALE ) == 0 );

      /* copy outline data */
      *outline = slot->glyph.loader->base.outline;

      outline->flags &= ~FT_OUTLINE_OWNER;
      outline->flags |= FT_OUTLINE_REVERSE_FILL;

      if ( size && pfrsize->metrics.y_ppem < 24 )
        outline->flags |= FT_OUTLINE_HIGH_PRECISION;

      /* compute the advance vector */
      metrics->horiAdvance = 0;
      metrics->vertAdvance = 0;

      advance    = gchar->advance;
      em_metrics = face->phy_font.metrics_resolution;
      em_outline = face->phy_font.outline_resolution;

      if ( em_metrics != em_outline )
        advance = FT_MulDiv( advance,
                             (FT_Long)em_outline,
                             (FT_Long)em_metrics );

      if ( face->phy_font.flags & PFR_PHY_VERTICAL )
        metrics->vertAdvance = advance;
      else
        metrics->horiAdvance = advance;

      pfrslot->linearHoriAdvance = metrics->horiAdvance;
      pfrslot->linearVertAdvance = metrics->vertAdvance;

      /* make up vertical metrics(?) */
      metrics->vertBearingX = 0;
      metrics->vertBearingY = 0;

#if 0 /* some fonts seem to be broken here! */

      /* Apply the font matrix, if any.                 */
      /* TODO: Test existing fonts with unusual matrix  */
      /* whether we have to adjust Units per EM.        */
      {
        FT_Matrix font_matrix;


        font_matrix.xx = face->log_font.matrix[0] << 8;
        font_matrix.yx = face->log_font.matrix[1] << 8;
        font_matrix.xy = face->log_font.matrix[2] << 8;
        font_matrix.yy = face->log_font.matrix[3] << 8;

        FT_Outline_Transform( outline, &font_matrix );
      }
#endif

      /* scale when needed */
      if ( scaling )
      {
        FT_Int      n;
        FT_Fixed    x_scale = pfrsize->metrics.x_scale;
        FT_Fixed    y_scale = pfrsize->metrics.y_scale;
        FT_Vector*  vec     = outline->points;


        /* scale outline points */
        for ( n = 0; n < outline->n_points; n++, vec++ )
        {
          vec->x = FT_MulFix( vec->x, x_scale );
          vec->y = FT_MulFix( vec->y, y_scale );
        }

        /* scale the advance */
        metrics->horiAdvance = FT_MulFix( metrics->horiAdvance, x_scale );
        metrics->vertAdvance = FT_MulFix( metrics->vertAdvance, y_scale );
      }

      /* compute the rest of the metrics */
      FT_Outline_Get_CBox( outline, &cbox );

      metrics->width        = cbox.xMax - cbox.xMin;
      metrics->height       = cbox.yMax - cbox.yMin;
      metrics->horiBearingX = cbox.xMin;
      metrics->horiBearingY = cbox.yMax - metrics->height;
    }

  Exit:
    return error;
  }